

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O1

Value MiniScript::Intrinsics::ListType(void)

{
  long *plVar1;
  byte bVar2;
  StringStorage *pSVar3;
  char *pcVar4;
  anon_union_8_3_2f476f46_for_data in_RDX;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  anon_union_8_3_2f476f46_for_data extraout_RDX_00;
  anon_union_8_3_2f476f46_for_data extraout_RDX_01;
  byte *in_RDI;
  Value VVar5;
  ValueDict d;
  Value local_158;
  undefined1 local_148 [8];
  anon_union_8_3_2f476f46_for_data local_140;
  Value local_138;
  Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> local_128;
  String local_110;
  String local_100;
  String local_f0;
  String local_e0;
  String local_d0;
  String local_c0;
  String local_b0;
  String local_a0;
  String local_90;
  String local_80;
  String local_70;
  String local_60;
  String local_50;
  String local_40;
  String local_30;
  
  if (_listType == 0) {
    local_128._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001d1238;
    local_128.ds = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
    local_128.isTemp = false;
    Value::Value(&local_158,"hasIndex");
    local_30.isTemp = false;
    pSVar3 = (StringStorage *)operator_new(0x30);
    (pSVar3->super_RefCountedStorage).refCount = 1;
    (pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar3->dataSize = 9;
    pSVar3->charCount = -1;
    pcVar4 = (char *)operator_new__(9);
    pSVar3->data = pcVar4;
    builtin_strncpy(pcVar4,"hasIndex",9);
    local_30.ss = pSVar3;
    Intrinsic::GetByName(&local_30);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              (&local_128,&local_158,(Value *)local_148);
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_30.ss != (StringStorage *)0x0) && (local_30.isTemp == false)) {
      plVar1 = &((local_30.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_30.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_30.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_158.type) && (local_158.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_158.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_158.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_158.data.number = 0.0;
    }
    Value::Value(&local_158,"indexes");
    local_40.isTemp = false;
    pSVar3 = (StringStorage *)operator_new(0x30);
    (pSVar3->super_RefCountedStorage).refCount = 1;
    (pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar3->dataSize = 8;
    pSVar3->charCount = -1;
    pcVar4 = (char *)operator_new__(8);
    pSVar3->data = pcVar4;
    builtin_strncpy(pcVar4,"indexes",8);
    local_40.ss = pSVar3;
    Intrinsic::GetByName(&local_40);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              (&local_128,&local_158,(Value *)local_148);
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_40.ss != (StringStorage *)0x0) && (local_40.isTemp == false)) {
      plVar1 = &((local_40.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_40.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_40.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_158.type) && (local_158.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_158.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_158.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_158.data.number = 0.0;
    }
    Value::Value(&local_158,"indexOf");
    local_50.isTemp = false;
    pSVar3 = (StringStorage *)operator_new(0x30);
    (pSVar3->super_RefCountedStorage).refCount = 1;
    (pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar3->dataSize = 8;
    pSVar3->charCount = -1;
    pcVar4 = (char *)operator_new__(8);
    pSVar3->data = pcVar4;
    builtin_strncpy(pcVar4,"indexOf",8);
    local_50.ss = pSVar3;
    Intrinsic::GetByName(&local_50);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              (&local_128,&local_158,(Value *)local_148);
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_50.ss != (StringStorage *)0x0) && (local_50.isTemp == false)) {
      plVar1 = &((local_50.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_50.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_50.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_158.type) && (local_158.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_158.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_158.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_158.data.number = 0.0;
    }
    Value::Value(&local_158,"insert");
    local_60.isTemp = false;
    pSVar3 = (StringStorage *)operator_new(0x30);
    (pSVar3->super_RefCountedStorage).refCount = 1;
    (pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar3->dataSize = 7;
    pSVar3->charCount = -1;
    pcVar4 = (char *)operator_new__(7);
    pSVar3->data = pcVar4;
    builtin_strncpy(pcVar4,"insert",7);
    local_60.ss = pSVar3;
    Intrinsic::GetByName(&local_60);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              (&local_128,&local_158,(Value *)local_148);
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_60.ss != (StringStorage *)0x0) && (local_60.isTemp == false)) {
      plVar1 = &((local_60.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_60.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_60.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_158.type) && (local_158.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_158.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_158.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_158.data.number = 0.0;
    }
    Value::Value(&local_158,"join");
    local_70.isTemp = false;
    pSVar3 = (StringStorage *)operator_new(0x30);
    (pSVar3->super_RefCountedStorage).refCount = 1;
    (pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar3->dataSize = 5;
    pSVar3->charCount = -1;
    pcVar4 = (char *)operator_new__(5);
    pSVar3->data = pcVar4;
    builtin_strncpy(pcVar4,"join",5);
    local_70.ss = pSVar3;
    Intrinsic::GetByName(&local_70);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              (&local_128,&local_158,(Value *)local_148);
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_70.ss != (StringStorage *)0x0) && (local_70.isTemp == false)) {
      plVar1 = &((local_70.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_70.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_70.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_158.type) && (local_158.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_158.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_158.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_158.data.number = 0.0;
    }
    Value::Value(&local_158,"len");
    local_80.isTemp = false;
    pSVar3 = (StringStorage *)operator_new(0x30);
    (pSVar3->super_RefCountedStorage).refCount = 1;
    (pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar3->dataSize = 4;
    pSVar3->charCount = -1;
    pcVar4 = (char *)operator_new__(4);
    pSVar3->data = pcVar4;
    builtin_strncpy(pcVar4,"len",4);
    local_80.ss = pSVar3;
    Intrinsic::GetByName(&local_80);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              (&local_128,&local_158,(Value *)local_148);
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_80.ss != (StringStorage *)0x0) && (local_80.isTemp == false)) {
      plVar1 = &((local_80.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_80.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_80.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_158.type) && (local_158.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_158.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_158.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_158.data.number = 0.0;
    }
    Value::Value(&local_158,"pop");
    local_90.isTemp = false;
    pSVar3 = (StringStorage *)operator_new(0x30);
    (pSVar3->super_RefCountedStorage).refCount = 1;
    (pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar3->dataSize = 4;
    pSVar3->charCount = -1;
    pcVar4 = (char *)operator_new__(4);
    pSVar3->data = pcVar4;
    builtin_strncpy(pcVar4,"pop",4);
    local_90.ss = pSVar3;
    Intrinsic::GetByName(&local_90);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              (&local_128,&local_158,(Value *)local_148);
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_90.ss != (StringStorage *)0x0) && (local_90.isTemp == false)) {
      plVar1 = &((local_90.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_90.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_90.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_158.type) && (local_158.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_158.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_158.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_158.data.number = 0.0;
    }
    Value::Value(&local_158,"pull");
    local_a0.isTemp = false;
    pSVar3 = (StringStorage *)operator_new(0x30);
    (pSVar3->super_RefCountedStorage).refCount = 1;
    (pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar3->dataSize = 5;
    pSVar3->charCount = -1;
    pcVar4 = (char *)operator_new__(5);
    pSVar3->data = pcVar4;
    builtin_strncpy(pcVar4,"pull",5);
    local_a0.ss = pSVar3;
    Intrinsic::GetByName(&local_a0);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              (&local_128,&local_158,(Value *)local_148);
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_a0.ss != (StringStorage *)0x0) && (local_a0.isTemp == false)) {
      plVar1 = &((local_a0.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_a0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_a0.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_158.type) && (local_158.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_158.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_158.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_158.data.number = 0.0;
    }
    Value::Value(&local_158,"push");
    local_b0.isTemp = false;
    pSVar3 = (StringStorage *)operator_new(0x30);
    (pSVar3->super_RefCountedStorage).refCount = 1;
    (pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar3->dataSize = 5;
    pSVar3->charCount = -1;
    pcVar4 = (char *)operator_new__(5);
    pSVar3->data = pcVar4;
    builtin_strncpy(pcVar4,"push",5);
    local_b0.ss = pSVar3;
    Intrinsic::GetByName(&local_b0);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              (&local_128,&local_158,(Value *)local_148);
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_b0.ss != (StringStorage *)0x0) && (local_b0.isTemp == false)) {
      plVar1 = &((local_b0.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_b0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_b0.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_158.type) && (local_158.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_158.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_158.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_158.data.number = 0.0;
    }
    Value::Value(&local_158,"shuffle");
    local_c0.isTemp = false;
    pSVar3 = (StringStorage *)operator_new(0x30);
    (pSVar3->super_RefCountedStorage).refCount = 1;
    (pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar3->dataSize = 8;
    pSVar3->charCount = -1;
    pcVar4 = (char *)operator_new__(8);
    pSVar3->data = pcVar4;
    builtin_strncpy(pcVar4,"shuffle",8);
    local_c0.ss = pSVar3;
    Intrinsic::GetByName(&local_c0);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              (&local_128,&local_158,(Value *)local_148);
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_c0.ss != (StringStorage *)0x0) && (local_c0.isTemp == false)) {
      plVar1 = &((local_c0.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_c0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_c0.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_158.type) && (local_158.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_158.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_158.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_158.data.number = 0.0;
    }
    Value::Value(&local_158,"sort");
    local_d0.isTemp = false;
    pSVar3 = (StringStorage *)operator_new(0x30);
    (pSVar3->super_RefCountedStorage).refCount = 1;
    (pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar3->dataSize = 5;
    pSVar3->charCount = -1;
    pcVar4 = (char *)operator_new__(5);
    pSVar3->data = pcVar4;
    builtin_strncpy(pcVar4,"sort",5);
    local_d0.ss = pSVar3;
    Intrinsic::GetByName(&local_d0);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              (&local_128,&local_158,(Value *)local_148);
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_d0.ss != (StringStorage *)0x0) && (local_d0.isTemp == false)) {
      plVar1 = &((local_d0.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_d0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_d0.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_158.type) && (local_158.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_158.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_158.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_158.data.number = 0.0;
    }
    Value::Value(&local_158,"sum");
    local_e0.isTemp = false;
    pSVar3 = (StringStorage *)operator_new(0x30);
    (pSVar3->super_RefCountedStorage).refCount = 1;
    (pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar3->dataSize = 4;
    pSVar3->charCount = -1;
    pcVar4 = (char *)operator_new__(4);
    pSVar3->data = pcVar4;
    builtin_strncpy(pcVar4,"sum",4);
    local_e0.ss = pSVar3;
    Intrinsic::GetByName(&local_e0);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              (&local_128,&local_158,(Value *)local_148);
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_e0.ss != (StringStorage *)0x0) && (local_e0.isTemp == false)) {
      plVar1 = &((local_e0.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_e0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_e0.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_158.type) && (local_158.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_158.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_158.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_158.data.number = 0.0;
    }
    Value::Value(&local_158,"remove");
    local_f0.isTemp = false;
    pSVar3 = (StringStorage *)operator_new(0x30);
    (pSVar3->super_RefCountedStorage).refCount = 1;
    (pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar3->dataSize = 7;
    pSVar3->charCount = -1;
    pcVar4 = (char *)operator_new__(7);
    pSVar3->data = pcVar4;
    builtin_strncpy(pcVar4,"remove",7);
    local_f0.ss = pSVar3;
    Intrinsic::GetByName(&local_f0);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              (&local_128,&local_158,(Value *)local_148);
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_f0.ss != (StringStorage *)0x0) && (local_f0.isTemp == false)) {
      plVar1 = &((local_f0.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_f0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_f0.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_158.type) && (local_158.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_158.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_158.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_158.data.number = 0.0;
    }
    Value::Value(&local_158,"replace");
    local_100.isTemp = false;
    pSVar3 = (StringStorage *)operator_new(0x30);
    (pSVar3->super_RefCountedStorage).refCount = 1;
    (pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar3->dataSize = 8;
    pSVar3->charCount = -1;
    pcVar4 = (char *)operator_new__(8);
    pSVar3->data = pcVar4;
    builtin_strncpy(pcVar4,"replace",8);
    local_100.ss = pSVar3;
    Intrinsic::GetByName(&local_100);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              (&local_128,&local_158,(Value *)local_148);
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_100.ss != (StringStorage *)0x0) && (local_100.isTemp == false)) {
      plVar1 = &((local_100.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_100.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_100.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_158.type) && (local_158.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_158.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_158.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_158.data.number = 0.0;
    }
    Value::Value(&local_158,"values");
    local_110.isTemp = false;
    pSVar3 = (StringStorage *)operator_new(0x30);
    (pSVar3->super_RefCountedStorage).refCount = 1;
    (pSVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
         (_func_int **)&PTR__StringStorage_001d10b0;
    pSVar3->dataSize = 7;
    pSVar3->charCount = -1;
    pcVar4 = (char *)operator_new__(7);
    pSVar3->data = pcVar4;
    builtin_strncpy(pcVar4,"values",7);
    local_110.ss = pSVar3;
    Intrinsic::GetByName(&local_110);
    Intrinsic::GetFunc((Intrinsic *)local_148);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              (&local_128,&local_158,(Value *)local_148);
    if ((Temp < local_148[0]) && (local_140.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_140.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_140.ref)->_vptr_RefCountedStorage[1])();
      }
      local_140.number = 0.0;
    }
    if ((local_110.ss != (StringStorage *)0x0) && (local_110.isTemp == false)) {
      plVar1 = &((local_110.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_110.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_110.ss = (StringStorage *)0x0;
    }
    if ((Temp < local_158.type) && (local_158.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_158.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_158.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_158.data.number = 0.0;
    }
    Value::Value(&local_138,&local_128);
    Value::operator=((Value *)&_listType,&local_138);
    in_RDX = extraout_RDX;
    if ((Temp < local_138.type) && ((FunctionStorage *)local_138.data.ref != (FunctionStorage *)0x0)
       ) {
      plVar1 = &(local_138.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_138.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
        in_RDX = extraout_RDX_00;
      }
      local_138.data.number = 0.0;
    }
    local_128._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001d1238;
    if ((local_128.ds != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
       (local_128.isTemp == false)) {
      plVar1 = (long *)((long)local_128.ds + 8);
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_128.ds)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        in_RDX = extraout_RDX_01;
      }
    }
  }
  bVar2 = _listType;
  *in_RDI = _listType;
  in_RDI[1] = DAT_001d31a1;
  in_RDI[2] = DAT_001d31a2;
  *(undefined8 *)(in_RDI + 8) = DAT_001d31a8;
  if ((2 < bVar2) && (*(long *)(in_RDI + 8) != 0)) {
    plVar1 = (long *)(*(long *)(in_RDI + 8) + 8);
    *plVar1 = *plVar1 + 1;
  }
  VVar5.data.number = in_RDX.number;
  VVar5._0_8_ = in_RDI;
  return VVar5;
}

Assistant:

Value Intrinsics::ListType() {
		if (_listType.IsNull()) {
			ValueDict d;
			d.SetValue("hasIndex", Intrinsic::GetByName("hasIndex")->GetFunc());
			d.SetValue("indexes", Intrinsic::GetByName("indexes")->GetFunc());
			d.SetValue("indexOf",  Intrinsic::GetByName("indexOf")->GetFunc());
			d.SetValue("insert",  Intrinsic::GetByName("insert")->GetFunc());
			d.SetValue("join",  Intrinsic::GetByName("join")->GetFunc());
			d.SetValue("len",  Intrinsic::GetByName("len")->GetFunc());
			d.SetValue("pop",  Intrinsic::GetByName("pop")->GetFunc());
			d.SetValue("pull",  Intrinsic::GetByName("pull")->GetFunc());
			d.SetValue("push",  Intrinsic::GetByName("push")->GetFunc());
			d.SetValue("shuffle",  Intrinsic::GetByName("shuffle")->GetFunc());
			d.SetValue("sort",  Intrinsic::GetByName("sort")->GetFunc());
			d.SetValue("sum",  Intrinsic::GetByName("sum")->GetFunc());
			d.SetValue("remove",  Intrinsic::GetByName("remove")->GetFunc());
			d.SetValue("replace",  Intrinsic::GetByName("replace")->GetFunc());
			d.SetValue("values",  Intrinsic::GetByName("values")->GetFunc());
			_listType = d;
		}
		return _listType;
	}